

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O0

void __thiscall Hpipe::CharItem::CharItem(CharItem *this,int type)

{
  int type_local;
  CharItem *this_local;
  
  this->type = type;
  Vec<Hpipe::CharEdge>::Vec(&this->edges);
  Vec<Hpipe::CharItem_*>::Vec(&this->prev);
  Cond::Cond(&this->cond);
  std::__cxx11::string::string((string *)&this->str);
  this->op_id = 0;
  CharItem::sid = CharItem::sid + 1;
  this->display_id = CharItem::sid;
  return;
}

Assistant:

CharItem::CharItem( int type ) : type( type ), op_id( 0 ) {
    static unsigned sid = 0;
    display_id = ++sid;
}